

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHCurl.cpp
# Opt level: O2

void TPZShapeHCurl<pzshape::TPZShapeTriang>::StaticIndexShapeToVec
               (TPZVec<int> *connectOrder,TPZVec<long> *firstH1ShapeFunc,TPZVec<int> *sidesH1Ord,
               TPZVec<long> *nodeIds,TPZVec<unsigned_int> *shapeCountVec,
               TPZVec<std::pair<int,_long>_> *indexVecShape)

{
  pair<int,_long> *ppVar1;
  long *plVar2;
  uint *puVar3;
  long lVar4;
  TPZVec<int> *order;
  int iVar5;
  int iVar6;
  MElementType MVar7;
  int iVar8;
  undefined4 extraout_var;
  ostream *poVar9;
  int *piVar10;
  int iVar11;
  int iVar12;
  int iNode;
  uint uVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  uint shapeCount;
  ulong local_550;
  ulong local_548;
  ulong local_540;
  ulong local_538;
  TPZVec<unsigned_int> *local_530;
  TPZVec<std::pair<int,_long>_> *local_528;
  int local_51c;
  TPZVec<long> *local_518;
  TPZVec<int> *local_510;
  TPZVec<long> *local_508;
  TPZVec<int> *local_500;
  ulong local_4f8;
  TPZGenMatrix<int> shapeorders;
  anon_class_32_4_a9a08e53 AddFromVec;
  TPZVec<std::pair<int,_int>_> funcXY;
  TPZManVector<int,_4> transformationIds;
  TPZVec<std::pair<int,_int>_> funcY;
  TPZVec<std::pair<int,_int>_> funcX;
  TPZManVector<int,_4> permutedSideSides;
  TPZManVector<int,_10> firstVfeVec;
  TPZVec<std::pair<int,_int>_> local_380;
  TPZVec<std::pair<int,_int>_> local_360;
  TPZVec<std::pair<int,_int>_> local_340;
  TPZManVector<TPZStack<int,_10>,_10> faceEdges;
  pair<int,_int> *ppVar13;
  
  local_530 = shapeCountVec;
  local_528 = indexVecShape;
  local_508 = firstH1ShapeFunc;
  iVar5 = pztopology::TPZTriangle::NumSides(2);
  local_540 = CONCAT44(local_540._4_4_,iVar5);
  iVar5 = pztopology::TPZTriangle::NumSides(1);
  local_548 = CONCAT44(extraout_var,iVar5);
  lVar21 = connectOrder->fNElements;
  faceEdges.super_TPZVec<TPZStack<int,_10>_>._vptr_TPZVec._0_4_ = 0xffffffff;
  local_500 = connectOrder;
  TPZManVector<int,_4>::TPZManVector(&transformationIds,4,(int *)&faceEdges);
  lVar20 = 0;
  if (lVar21 < 1) {
    lVar21 = lVar20;
  }
  for (; lVar21 != lVar20; lVar20 = lVar20 + 1) {
    iVar5 = pztopology::TPZTriangle::GetTransformId((int)lVar20 + 3,nodeIds);
    transformationIds.super_TPZVec<int>.fStore[lVar20] = iVar5;
  }
  shapeCount = 0;
  local_538 = (ulong)(uint)((int)local_548 * 2);
  uVar17 = 0;
  local_550 = 0;
  local_518 = nodeIds;
  local_510 = sidesH1Ord;
  if (0 < (int)local_548) {
    local_550 = local_548 & 0xffffffff;
  }
  for (; uVar17 != local_550; uVar17 = uVar17 + 1) {
    iVar5 = local_500->fStore[uVar17];
    iVar11 = (int)uVar17;
    for (uVar14 = 0; uVar14 != 2; uVar14 = uVar14 + 1) {
      uVar22 = transformationIds.super_TPZVec<int>.fStore[uVar17] != 0 ^ uVar14;
      iVar6 = pztopology::TPZTriangle::SideNodeLocId(iVar11 + 3,uVar22);
      ppVar1 = local_528->fStore;
      ppVar1[shapeCount].first = uVar22 | iVar11 * 2;
      ppVar1[shapeCount].second = (long)iVar6;
      shapeCount = shapeCount + 1;
      local_530->fStore[uVar17] = local_530->fStore[uVar17] + 1;
    }
    plVar2 = local_508->fStore;
    ppVar1 = local_528->fStore;
    if (iVar5 < 2) {
      iVar5 = 1;
    }
    puVar3 = local_530->fStore;
    for (iVar6 = 0; iVar5 + -1 != iVar6; iVar6 = iVar6 + 1) {
      lVar21 = plVar2[uVar17];
      ppVar1[shapeCount].first = (int)local_538 + iVar11;
      ppVar1[shapeCount].second = (long)((int)lVar21 + iVar6);
      shapeCount = shapeCount + 1;
      puVar3[uVar17] = puVar3[uVar17] + 1;
    }
  }
  lVar20 = (long)(int)local_540;
  faceEdges.super_TPZVec<TPZStack<int,_10>_>._vptr_TPZVec._0_4_ = 0xffffffff;
  TPZManVector<int,_10>::TPZManVector(&firstVfeVec,lVar20,(int *)&faceEdges);
  TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&permutedSideSides,0,0);
  TPZManVector<TPZStack<int,_10>,_10>::TPZManVector
            (&faceEdges,lVar20,(TPZStack<int,_10> *)&permutedSideSides);
  TPZManVector<int,_10>::~TPZManVector((TPZManVector<int,_10> *)&permutedSideSides);
  iVar5 = (int)local_548;
  *firstVfeVec.super_TPZVec<int>.fStore = iVar5 * 3;
  lVar21 = 0;
  uVar17 = 0;
  if (0 < (int)local_540) {
    uVar17 = local_540 & 0xffffffff;
  }
  for (uVar19 = 0; order = local_510, uVar17 != uVar19; uVar19 = uVar19 + 1) {
    pztopology::TPZTriangle::LowerDimensionSides
              (iVar5 + 3 + (int)uVar19,
               (TPZStack<int,_10> *)
               ((long)((faceEdges.super_TPZVec<TPZStack<int,_10>_>.fStore)->
                      super_TPZManVector<int,_10>).fExtAlloc + lVar21 + -0x20),1);
    if (uVar19 == 0) {
      iVar11 = *firstVfeVec.super_TPZVec<int>.fStore;
    }
    else {
      iVar11 = firstVfeVec.super_TPZVec<int>.fStore[uVar19 - 1] +
               *(int *)((long)((faceEdges.super_TPZVec<TPZStack<int,_10>_>.fStore)->
                              super_TPZManVector<int,_10>).fExtAlloc + lVar21 + -0x58);
    }
    firstVfeVec.super_TPZVec<int>.fStore[uVar19] = iVar11;
    lVar21 = lVar21 + 0x48;
  }
  local_4f8 = (ulong)(uint)(firstVfeVec.super_TPZVec<int>.fStore[lVar20 + -1] +
                           (int)faceEdges.super_TPZVec<TPZStack<int,_10>_>.fStore[lVar20 + -1].
                                super_TPZManVector<int,_10>.super_TPZVec<int>.fNElements);
  iVar5 = pzshape::TPZShapeTriang::NShapeF(local_510);
  TPZGenMatrix<int>::TPZGenMatrix(&shapeorders,(long)iVar5,3);
  pzshape::TPZShapeTriang::ShapeOrder(local_518,order,&shapeorders);
  iVar6 = (int)local_548;
  iVar11 = (int)local_540 + iVar6;
  iVar5 = (int)local_4f8;
  lVar21 = (long)iVar6;
  do {
    if (iVar11 <= lVar21) {
      TPZGenMatrix<int>::~TPZGenMatrix(&shapeorders);
      TPZManVector<TPZStack<int,_10>,_10>::~TPZManVector(&faceEdges);
      TPZManVector<int,_10>::~TPZManVector(&firstVfeVec);
      TPZManVector<int,_4>::~TPZManVector(&transformationIds);
      return;
    }
    funcXY._vptr_TPZVec._0_4_ = 0xffffffff;
    TPZManVector<int,_4>::TPZManVector(&permutedSideSides,4,(int *)&funcXY);
    iVar15 = (int)lVar21 + 3;
    MVar7 = pztopology::TPZTriangle::Type(iVar15);
    if (MVar7 == ETriangle) {
      pztopology::GetPermutation<pztopology::TPZTriangle>
                (transformationIds.super_TPZVec<int>.fStore[lVar21],
                 &permutedSideSides.super_TPZVec<int>);
      uVar14 = local_500->fStore[lVar21];
    }
    else {
      if (MVar7 != EQuadrilateral) {
        poVar9 = std::operator<<((ostream *)&std::cerr,
                                 "static void TPZShapeHCurl<pzshape::TPZShapeTriang>::StaticIndexShapeToVec(const TPZVec<int> &, const TPZVec<int64_t> &, const TPZVec<int> &, const TPZVec<int64_t> &, TPZVec<unsigned int> &, TPZVec<std::pair<int, int64_t>> &) [TSHAPE = pzshape::TPZShapeTriang]"
                                );
        poVar9 = std::operator<<(poVar9," error.");
        std::endl<char,std::char_traits<char>>(poVar9);
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHCurl.cpp"
                   ,0x1a8);
      }
      pztopology::GetPermutation<pztopology::TPZQuadrilateral>
                (transformationIds.super_TPZVec<int>.fStore[lVar21],
                 &permutedSideSides.super_TPZVec<int>);
      uVar14 = local_500->fStore[lVar21] + 1;
    }
    local_550 = (ulong)uVar14;
    local_538 = CONCAT44(local_538._4_4_,iVar15);
    uVar14 = pztopology::TPZTriangle::NSideNodes(iVar15);
    local_548 = lVar21 - iVar6;
    iVar15 = (int)local_550 + -1;
    if (iVar15 < 1) {
      iVar15 = 0;
    }
    local_540 = (ulong)(int)uVar14;
    uVar17 = 0;
    if (0 < (int)uVar14) {
      uVar17 = (ulong)uVar14;
    }
    for (uVar19 = 0; iVar18 = (int)local_538, uVar19 != uVar17; uVar19 = uVar19 + 1) {
      iVar18 = permutedSideSides.super_TPZVec<int>.fStore[uVar19 + local_540];
      iVar8 = pztopology::TPZTriangle::ContainedSideLocId((int)local_538,iVar18);
      iVar12 = firstVfeVec.super_TPZVec<int>.fStore[local_548];
      plVar2 = local_508->fStore;
      ppVar1 = local_528->fStore;
      puVar3 = local_530->fStore;
      for (iVar16 = 0; iVar15 != iVar16; iVar16 = iVar16 + 1) {
        lVar20 = plVar2[(long)iVar8 + -3];
        ppVar1[shapeCount].first = (iVar18 - uVar14) + iVar12;
        ppVar1[shapeCount].second = (long)((int)lVar20 + iVar16);
        shapeCount = shapeCount + 1;
        puVar3[lVar21] = puVar3[lVar21] + 1;
      }
    }
    uVar14 = pzshape::TPZShapeTriang::NConnectShapeF((int)local_538,(int)local_550);
    MVar7 = pztopology::TPZTriangle::Type(iVar18);
    if (MVar7 == EQuadrilateral) {
      uVar17 = (long)(transformationIds.super_TPZVec<int>.fStore[lVar21] + 1) / 2;
      iVar15 = (int)local_550 + -2;
      TPZVec<std::pair<int,_int>_>::TPZVec(&funcXY,(long)(iVar15 * iVar15 * 2));
      TPZVec<std::pair<int,_int>_>::TPZVec(&funcX,(long)iVar15);
      TPZVec<std::pair<int,_int>_>::TPZVec(&funcY,(long)iVar15);
      iVar15 = (int)((long)((ulong)(uint)((int)uVar17 >> 0x1f) << 0x20 | uVar17 & 0xffffffff) % 2);
      local_540 = CONCAT44(local_540._4_4_,iVar5 + (int)local_548 * 2);
      local_518 = (TPZVec<long> *)CONCAT44(local_518._4_4_,iVar5 + (int)local_548 * 2 + 1);
      uVar19 = 0;
      uVar17 = (ulong)uVar14;
      if ((int)uVar14 < 1) {
        uVar17 = uVar19;
      }
      local_538 = (ulong)(1 - iVar15);
      local_510 = (TPZVec<int> *)((ulong)local_510 & 0xffffffff00000000);
      local_548 = local_548 & 0xffffffff00000000;
      local_51c = 0;
      for (; uVar17 != uVar19; uVar19 = uVar19 + 1) {
        lVar4 = local_508->fStore[lVar21];
        lVar20 = uVar19 + lVar4;
        piVar10 = TPZGenMatrix<int>::operator()(&shapeorders,lVar20,(long)iVar15);
        iVar18 = (int)lVar4;
        if ((*piVar10 < (int)local_550) &&
           (piVar10 = TPZGenMatrix<int>::operator()(&shapeorders,lVar20,local_538),
           *piVar10 < (int)local_550)) {
          iVar18 = iVar18 + (int)uVar19;
          lVar20 = (long)(int)local_510;
          funcXY.fStore[lVar20].first = (int)local_540;
          funcXY.fStore[lVar20].second = iVar18;
          local_510 = (TPZVec<int> *)CONCAT44(local_510._4_4_,(int)local_510 + 2);
          funcXY.fStore[lVar20 + 1].first = (int)local_518;
          funcXY.fStore[lVar20 + 1].second = iVar18;
        }
        else {
          piVar10 = TPZGenMatrix<int>::operator()(&shapeorders,lVar20,(long)iVar15);
          if (*piVar10 < (int)local_550) {
            iVar12 = (int)local_548;
            local_548 = CONCAT44(local_548._4_4_,(int)local_548 + 1);
            ppVar13 = funcX.fStore;
            iVar8 = (int)local_540;
          }
          else {
            piVar10 = TPZGenMatrix<int>::operator()(&shapeorders,lVar20,local_538);
            if ((int)local_550 <= *piVar10) goto LAB_00f79ce7;
            ppVar13 = funcY.fStore;
            iVar8 = (int)local_518;
            iVar12 = local_51c;
            local_51c = local_51c + 1;
          }
          ppVar13[iVar12].first = iVar8;
          ppVar13[iVar12].second = iVar18 + (int)uVar19;
        }
LAB_00f79ce7:
      }
      AddFromVec.indexVecShape = local_528;
      AddFromVec.shapeCountVec = local_530;
      AddFromVec.shapeCount = &shapeCount;
      AddFromVec.iCon = (int)lVar21;
      TPZVec<std::pair<int,_int>_>::TPZVec(&local_340,&funcXY);
      StaticIndexShapeToVec::anon_class_32_4_a9a08e53::operator()(&AddFromVec,&local_340);
      TPZVec<std::pair<int,_int>_>::~TPZVec(&local_340);
      TPZVec<std::pair<int,_int>_>::TPZVec(&local_360,&funcX);
      StaticIndexShapeToVec::anon_class_32_4_a9a08e53::operator()(&AddFromVec,&local_360);
      TPZVec<std::pair<int,_int>_>::~TPZVec(&local_360);
      TPZVec<std::pair<int,_int>_>::TPZVec(&local_380,&funcY);
      StaticIndexShapeToVec::anon_class_32_4_a9a08e53::operator()(&AddFromVec,&local_380);
      TPZVec<std::pair<int,_int>_>::~TPZVec(&local_380);
      TPZVec<std::pair<int,_int>_>::~TPZVec(&funcY);
      TPZVec<std::pair<int,_int>_>::~TPZVec(&funcX);
      TPZVec<std::pair<int,_int>_>::~TPZVec(&funcXY);
    }
    else {
      plVar2 = local_508->fStore;
      ppVar1 = local_528->fStore;
      puVar3 = local_530->fStore;
      uVar17 = 0;
      uVar22 = uVar14 * 2;
      if ((int)(uVar14 * 2) < 1) {
        uVar22 = 0;
      }
      while (uVar14 = (uint)uVar17, uVar22 != uVar14) {
        lVar20 = plVar2[lVar21];
        ppVar1[shapeCount].first = (uVar14 & 1) + (int)local_4f8 + (int)local_548 * 2;
        ppVar1[shapeCount].second = (uVar17 >> 1) + lVar20;
        shapeCount = shapeCount + 1;
        puVar3[lVar21] = puVar3[lVar21] + 1;
        uVar17 = (ulong)(uVar14 + 1);
      }
    }
    TPZManVector<int,_4>::~TPZManVector(&permutedSideSides);
    lVar21 = lVar21 + 1;
  } while( true );
}

Assistant:

void TPZShapeHCurl<TSHAPE>::StaticIndexShapeToVec(const TPZVec<int>& connectOrder,
                                                  const TPZVec<int64_t>& firstH1ShapeFunc,
                                                  const TPZVec<int>& sidesH1Ord,
                                                  const TPZVec<int64_t>& nodeIds,
                                                  TPZVec<unsigned int>& shapeCountVec,
                                                  TPZVec<std::pair<int,int64_t>> & indexVecShape
                                                  ) {



    //                                                  TPZVec<std::pair<int,int64_t>> & indexVecShape,
    //                                                       const TPZVec<int>& connectOrder,
    //                                                       const TPZVec<int64_t>& firstH1ShapeFunc,
    //                                                       const TPZVec<int>& sidesH1Ord,
    //                                                       TPZVec<unsigned int>& shapeCountVec,
    //                                                       const TPZVec<int64_t>& nodeIds) {
    /******************************************************************************************************************
     * The directions are calculated based on the LOCAL side ids (and SideNodeLocId), such as the H1 shape functions.
     * For instance, for the triangle, the vectors are:
     * vea30 vea31 vea41 vea42 vea52 vea51 vet3 vet4 vet5 vfe63 vfe64 vfe65 vft1 vft2
     * and the shapes will be organized as follows:
     * phi0 phi1 phi2  phi31 phi32 ... phi3i   phi41 phi42 ... phi4j   phi51 phi52 ... phi5k   phi61 phi62 ... phi6n
     *^^^^^^^^^^^^^^^  ^^^^^^^^^^^^^^^^^^^^^   ^^^^^^^^^^^^^^^^^^^^^   ^^^^^^^^^^^^^^^^^^^^^   ^^^^^^^^^^^^^^^^^^^^^
     *  corner funcs       edge 3 funcs            edge 4 funcs            edge 5 funcs            internal funcs
     *
     * In order to ensure that the functions will coincide in two neighbouring elements, they will be then sorted by
     * their sides' GLOBAL ids instead of their LOCAL ids
     ******************************************************************************************************************/

    
    const auto nFaces = TSHAPE::Dimension < 2 ? 0 : TSHAPE::NumSides(2);
    const auto nEdges = TSHAPE::NumSides(1);
    constexpr auto nNodes = TSHAPE::NCornerNodes;

    const auto nConnects = connectOrder.size();
    TPZManVector<int, TSHAPE::NSides - nNodes>
        transformationIds(TSHAPE::NSides - nNodes, -1);
    //computing transformation id for sides.
    for (auto iCon = 0; iCon < nConnects; iCon++) {
        transformationIds[iCon] = TSHAPE::GetTransformId(nNodes + iCon, nodeIds);
    }
    
    unsigned int shapeCount = 0;


    //calculates edge functions
    for (auto iCon = 0; iCon < nEdges; iCon++) {
        const auto pOrder = connectOrder[iCon];
        //there will be 2 + pOrder - 1 = pOrder + 1 functions for each edge

        for (auto iNode = 0; iNode < 2; iNode++) {
            auto whichNode = transformationIds[iCon] == 0 ? iNode : (iNode + 1) % 2;
            const int vecIndex = iCon * 2 + whichNode;
            const int64_t shapeIndex = TSHAPE::SideNodeLocId(iCon + nNodes, whichNode);
            indexVecShape[shapeCount] = std::make_pair(vecIndex, shapeIndex);
            shapeCount++;
            shapeCountVec[iCon]++;
        }//phi^ea funcs
        const int vecIndex = nEdges * 2 + iCon;
        for (int iEdgeInternal = 0; iEdgeInternal < pOrder - 1; iEdgeInternal++) {
            const int shapeIndex = firstH1ShapeFunc[iCon] + iEdgeInternal;
            indexVecShape[shapeCount] = std::make_pair(vecIndex, shapeIndex);
            shapeCount++;
            shapeCountVec[iCon]++;
        }//phi^et funcs
    }

    const int firstFaceShape = shapeCount;

#ifdef PZ_LOG2
    if (logger.isDebugEnabled()) {
        std::ostringstream sout;
        sout << __PRETTY_FUNCTION__ << '\n'
             << " n shape funcs (edge connects): "<<shapeCount<<'\n';
        //thats way too much info, uncomment if needed
        
        // sout << "vec shape index (edge connects):" << std::endl;
        // for (int iShape = 0; iShape < firstFaceShape; iShape++) {
        //     auto pair = indexVecShape[iShape];
        //     sout << "\tvec: " << pair.first << "\tshape: " << pair.second << std::endl;
        // }
        LOGPZ_DEBUG(logger, sout.str())
            }
#endif
    if(TSHAPE::Dimension < 2) return;
    /**
     * In order to ease the calculation of the indexes, these structures will store, respectively:
     * a) firstVfeVec the first Vfe vector for each face
     * b) faceEdges the edges contained in a certain face
     * c) firstVftVec the first Vft vector. Then, it is firstVftVec + 2*iFace + iVec
     * d) firstVfOrthVec the first VfOrthVec. Then, it is firstVfOrthVec + iFace
     */
    TPZManVector<int> firstVfeVec(nFaces,-1);
    TPZManVector<TPZStack<int>> faceEdges(nFaces,TPZStack<int>(0,0));
    {
        //we skip v^{e,a} and v^{e,T} vectors
        const int nEdgeVectors = nEdges * 3;
        firstVfeVec[0] = nEdgeVectors;
        for(auto iFace = 0; iFace < nFaces; iFace++){
            TSHAPE::LowerDimensionSides(iFace + nEdges + nNodes, faceEdges[iFace], 1);
            const int nFaceEdges = iFace == 0 ? 0 : faceEdges[iFace-1].size();
            firstVfeVec[iFace] = iFace == 0 ?
                firstVfeVec[iFace] : firstVfeVec[iFace - 1] + nFaceEdges;
        }
    }
    const int firstVftVec = firstVfeVec[nFaces-1] + faceEdges[nFaces-1].size();
    const int firstVfOrthVec = firstVftVec + 2 * nFaces;

    const int nH1Funcs = TSHAPE::NShapeF(sidesH1Ord);
    TPZGenMatrix<int> shapeorders(nH1Funcs,3);
    TSHAPE::ShapeOrder(nodeIds,sidesH1Ord, shapeorders);
    
    for(auto iCon = nEdges; iCon < nEdges + nFaces; iCon++){
        const auto iSide = iCon + nNodes;
        const auto iFace = iCon - nEdges;

        int h1FaceOrder = -1;
        TPZManVector<int,4> permutedSideSides(4,-1);
        
        switch(TSHAPE::Type(iSide)){
        case ETriangle://triangular face
            pztopology::GetPermutation<pztopology::TPZTriangle>(transformationIds[iCon],
                                                                permutedSideSides);
            h1FaceOrder = connectOrder[iCon];
            break;
        case EQuadrilateral://quadrilateral face
            pztopology::GetPermutation<pztopology::TPZQuadrilateral>(transformationIds[iCon],
                                                                     permutedSideSides);
            h1FaceOrder = connectOrder[iCon]+1;
            break;
        default:
            PZError<<__PRETTY_FUNCTION__<<" error."<<std::endl;
            DebugStop();
        }
#ifdef PZ_LOG2
        if (logger.isDebugEnabled()) {
            std::ostringstream sout;
            sout << "face :"<< iSide <<" permutation:"<< std::endl;
            for (auto i = 0; i < permutedSideSides.size(); i++) sout << permutedSideSides[i]<<"\t";
            sout<<std::endl;
            sout<<"transformation id:"<<transformationIds[iCon]<<std::endl;
            LOGPZ_DEBUG(logger, sout.str())
                }
#endif


        const int nFaceNodes = TSHAPE::NSideNodes(iSide);
        //this is not a mistake, since for faces nEdges = nNodes
        const int &nFaceEdges = nFaceNodes;

        //first the phi Fe functions
        for(auto iEdge = 0; iEdge < nFaceEdges; iEdge++ ){
            const auto currentLocalEdge = permutedSideSides[iEdge+nFaceNodes];
            const auto currentEdge = TSHAPE::ContainedSideLocId(iSide, currentLocalEdge);
            const auto vecIndex = firstVfeVec[iFace] + currentLocalEdge - nFaceNodes;
            
            for(auto iEdgeInternal = 0; iEdgeInternal < h1FaceOrder - 1; iEdgeInternal++){
                const int shapeIndex = firstH1ShapeFunc[currentEdge - nNodes] + iEdgeInternal;
                indexVecShape[shapeCount] = std::make_pair(vecIndex,shapeIndex);
                shapeCount++;
                shapeCountVec[iCon]++;
            }
        }

        const auto nVfeFuncs = shapeCountVec[iCon];
        
        /**now the phi Fi functions
           They are calculated differently for quad and triangular faces.
           For triangular faces, all the face functions of order k are taken,
           and each is multiplied by each of the tangent vectors associated with
           the face.
           For quadrilateral faces, the face functions of order k+1 are taken:
           since we are interested in the Q_{k,k+1}\times Q_{k+1,k} space,
           we check their orders.*/
        
        //number of h1 face funcs
        const auto nH1FaceFuncs =
            TSHAPE::NConnectShapeF(iSide,h1FaceOrder);
        
        const auto quadFace = TSHAPE::Type(iSide) == EQuadrilateral;
        
        if(quadFace){
            const auto transid = transformationIds[iCon];
            /*
              transformation id is 0 or 1 if starting at node 0
              transformation id is 2 or 3 if starting at node 1
              transformation id is 4 or 5 if starting at node 2
              transformation id is 6 or 7 if starting at node 3
              even numbers are counterclockwise dir,
              odd numbers are clockwise direction
              so ids 0, 3, 4, 7 have x as first dir
              and 1, 2, 5, 6 have y as first dir.

              we know that the vft vectors are created
              such that the first one is in x and the second one
              is in y (local face coordinates).
              therefore, we need the variables in the h1 functions
              to match.
              warning: sketchy integer arithmetic will follow:
             */
            const auto xdir = ((transid+1)/2)%2;//i told you so
            const auto ydir = 1-xdir;

            const auto hCurlFaceOrder = h1FaceOrder-1;
            const auto nfuncsk = 2 * (hCurlFaceOrder - 1) * (hCurlFaceOrder - 1);
            const auto nfuncsk1 = hCurlFaceOrder - 1;
            TPZVec<std::pair<int,int>> funcXY(nfuncsk);
            TPZVec<std::pair<int,int>> funcX(nfuncsk1);
            TPZVec<std::pair<int,int>> funcY(nfuncsk1);
            int countxy{0}, countx{0},county{0};
            /**now we assume that the first vft vec is in the x direction
               and that the next one is in the y direction.*/
            const int vecindex[] = {firstVftVec + 2*iFace,firstVftVec + 2*iFace+1};
            for(auto iFunc = 0; iFunc < nH1FaceFuncs; iFunc++ ){
                const auto shapeIndex = firstH1ShapeFunc[iCon] + iFunc;

                //functions of degree k
                if((shapeorders(shapeIndex,xdir) <= hCurlFaceOrder) &&
                   (shapeorders(shapeIndex,ydir) <= hCurlFaceOrder)){
                    funcXY[countxy++] = {vecindex[0],shapeIndex};
                    funcXY[countxy++] = {vecindex[1],shapeIndex};
                }else if(shapeorders(shapeIndex,xdir) <= hCurlFaceOrder){
                    funcX[countx++] = {vecindex[0],shapeIndex};
                }else if(shapeorders(shapeIndex,ydir) <= hCurlFaceOrder){
                    funcY[county++] = {vecindex[1],shapeIndex};
                }
            }

            auto AddFromVec = [&indexVecShape,&shapeCountVec, &shapeCount,iCon]
                (TPZVec<std::pair<int,int>> myvec){
                for(auto [vi,si] : myvec){
                    indexVecShape[shapeCount] = std::make_pair(vi,si);
                    shapeCount++;
                    shapeCountVec[iCon]++;
                }
            };
            AddFromVec(funcXY);
            AddFromVec(funcX);
            AddFromVec(funcY);
            
        }
        else{
            //ok that one is easy to guess
            const auto nFaceInternalFuncs =
                2 * nH1FaceFuncs;
            for(auto iFunc = 0; iFunc < nFaceInternalFuncs; iFunc++ ){
                //it should alternate between them
                const auto vecIndex = firstVftVec + 2*iFace + iFunc % 2;
                //they should repeat
                const auto shapeIndex = firstH1ShapeFunc[iCon] + iFunc / 2;
                indexVecShape[shapeCount] = std::make_pair(vecIndex,shapeIndex);
                shapeCount++;
                shapeCountVec[iCon]++;
            }
        }

        const auto nVfiFuncs = shapeCountVec[iCon] - nVfeFuncs;
#ifdef PZ_LOG2
        if (logger.isDebugEnabled()) {
            std::ostringstream sout;
            sout << "iFace: "<<iFace<<' '
                 << "nVfeFuncs: "<< nVfeFuncs <<' '
                 << "nVfiFuncs: "<< nVfiFuncs << '\n';
            LOGPZ_DEBUG(logger, sout.str())
                }
#endif
    }

#ifdef PZ_LOG2
    if (logger.isDebugEnabled()) {
        std::ostringstream sout;
        sout << "n shape funcs (face connects): "
             << firstInternalShape - firstFaceShape << '\n';
        //way too much info, uncomment if needed
        // sout << "vec shape index (face connects):" << std::endl;
        // for (int iShape = firstFaceShape; iShape < firstInternalShape; iShape++) {
        //     auto pair = indexVecShape[iShape];
        //     sout << "\tvec: " << pair.first << "\tshape: " << pair.second << std::endl;
        // }
        LOGPZ_DEBUG(logger, sout.str())
            }
#endif

    if(TSHAPE::Dimension < 3) return;

    const int firstInternalShape = shapeCount;
    
    const int iCon = nEdges + nFaces;
    //hcurl connect order
    const auto sideOrder = connectOrder[iCon];
    //first, the phi KF functions
    for(int iFace = 0; iFace < nFaces; iFace++){
        const auto faceSide = iFace + nEdges + nNodes;
        const auto faceType = TSHAPE::Type(faceSide);
        const auto faceDim = TSHAPE::SideDimension(faceSide);
        const auto faceOrderH1 =
            TSHAPE::Type() == EPrisma || TSHAPE::Type() == ECube ?
            sideOrder + 1 : sideOrder;
        const auto nH1FaceFuncs =
            TSHAPE::NConnectShapeF(faceSide,faceOrderH1);
        const auto vecIndex = firstVfOrthVec + iFace;

        for(auto iFunc = 0; iFunc < nH1FaceFuncs; iFunc++ ){
            const auto shapeIndex = firstH1ShapeFunc[nEdges + iFace] + iFunc;

            bool skip = false;
            if constexpr(TSHAPE::Type() == EPrisma){
                const int ordvec[] =
                    {shapeorders(shapeIndex,0),shapeorders(shapeIndex,1)};
                skip = true;
                if((TSHAPE::Type(faceSide) == EQuadrilateral) &&
                   (ordvec[0] <= sideOrder) &&
                   (ordvec[1] <= sideOrder+1)){
                    //for quad faces ordvec[0] = xord and ordvec[1] = zord
                    skip = false;
                    
                }
                else if(TSHAPE::Type(faceSide) == ETriangle){
                    skip = false;
                }
            }
            if(!skip){
                indexVecShape[shapeCount] = std::make_pair(vecIndex,shapeIndex);
                shapeCount++;
                shapeCountVec[iCon]++;
            }
        }   
    }

    const auto nKfFuncs = shapeCount - firstInternalShape;

    const auto h1InternalOrd = sidesH1Ord[nEdges+nFaces];
    //now the phi Ki funcs
    const int firstInternalVec = firstVfOrthVec + nFaces;
    //ALL H1 internal functions
    const auto nH1Internal =
        TSHAPE::NConnectShapeF(TSHAPE::NSides - 1, h1InternalOrd);

    const auto xVecIndex = firstInternalVec + 0;
    const auto yVecIndex = firstInternalVec + 1;
    const auto zVecIndex = firstInternalVec + 2;

    auto addFunc = [&indexVecShape,&shapeCount,&shapeCountVec,iCon](
      int vIndex, int sIndex){
        indexVecShape[shapeCount] = std::make_pair(vIndex, sIndex);
        shapeCount++;
        shapeCountVec[iCon]++;
    };
    /**in order to filter the gradients of hcurl functions,
       we need to sort the shape functions for the hexahedral el*/
    auto AddToVec = [](TPZVec<std::pair<int,int>> &v,std::pair<int,int> vs){
        const auto vi = v.size();
        v.Resize(vi+1);
        v[vi] = vs;
    };

    TPZVec<std::pair<int,int>> funcXYZ, funcX, funcY, funcZ;
    
    
    for(auto iFunc = 0; iFunc < nH1Internal; iFunc++ ){
        const auto shapeIndex = firstH1ShapeFunc[iCon] + iFunc;
        const int xord = shapeorders(shapeIndex,0);
        const int yord = shapeorders(shapeIndex,1);
        const int zord = shapeorders(shapeIndex,2);
        if constexpr(TSHAPE::Type() == ECube){
            if(xord <= sideOrder && yord <= sideOrder && zord <= sideOrder){
                AddToVec(funcXYZ, std::make_pair(xVecIndex,shapeIndex));
                AddToVec(funcXYZ, std::make_pair(yVecIndex,shapeIndex));
                AddToVec(funcXYZ, std::make_pair(zVecIndex,shapeIndex));
            }
            else{
                if(xord <= sideOrder){
                    AddToVec(funcX, std::make_pair(xVecIndex,shapeIndex));
                }
                if(yord <= sideOrder){
                    AddToVec(funcY, std::make_pair(yVecIndex,shapeIndex));
                }
                if(zord <= sideOrder){
                    AddToVec(funcZ, std::make_pair(zVecIndex,shapeIndex));
                }
            }
        }
        else if constexpr(TSHAPE::Type() == EPrisma){
            if((xord <= sideOrder) &&
               (yord <= sideOrder) &&
               (zord <= sideOrder+1)){
                addFunc(xVecIndex,shapeIndex);
                addFunc(yVecIndex,shapeIndex);
            }
            if((xord <= sideOrder+1) &&
               (yord <= sideOrder+1) &&
               (zord <= sideOrder)){
                addFunc(zVecIndex,shapeIndex);
            }
        }
        else{
            addFunc(xVecIndex,shapeIndex);
            addFunc(yVecIndex,shapeIndex);
            addFunc(zVecIndex,shapeIndex);
        }
    }
    //now we actually add the functions
    if constexpr(TSHAPE::Type() == ECube){
        for(auto [v,s] : funcXYZ){
            addFunc(v,s);
        }
        for(auto [v,s] : funcX){
            addFunc(v,s);
        }
        for(auto [v,s] : funcY){
            addFunc(v,s);
        }
        for(auto [v,s] : funcZ){
            addFunc(v,s);
        }
    }
    
    if(shapeCount != indexVecShape.size()){
        DebugStop();
    }
#ifdef PZ_LOG2
    if (logger.isDebugEnabled()) {
        const auto nInternalFuncs = shapeCount - firstInternalShape;
        const auto nKiFuncs = nInternalFuncs - nKfFuncs;
        std::ostringstream sout;
        sout << "n shape funcs (internal connect): "
             << shapeCount - firstInternalShape << '\n'
             << "\t n kf funcs : " << nKfFuncs
             << "\t n ki funcs : " << nKiFuncs << '\n';
        LOGPZ_DEBUG(logger, sout.str())
            }
#endif
}